

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::matrix3d> *value)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  matrix3d *pmVar4;
  storage_t<tinyusdz::value::matrix3d> *psVar5;
  byte bVar6;
  matrix3d v;
  matrix3d local_58;
  
  bVar6 = 0;
  bVar2 = MaybeNone(this);
  if (bVar2) {
    value->has_value_ = false;
    bVar2 = true;
  }
  else {
    local_58.m[0][0] = 1.0;
    local_58.m[0][1] = 0.0;
    local_58.m[0][2] = 0.0;
    local_58.m[1][0] = 0.0;
    local_58.m[1][1] = 1.0;
    local_58.m[1][2] = 0.0;
    local_58.m[2][0] = 0.0;
    local_58.m[2][1] = 0.0;
    local_58.m[2][2] = 1.0;
    bVar2 = ParseMatrix(this,&local_58);
    if (bVar2) {
      bVar1 = value->has_value_;
      pmVar4 = &local_58;
      psVar5 = &value->contained;
      for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined8 *)psVar5 = *(undefined8 *)pmVar4;
        pmVar4 = (matrix3d *)((long)pmVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        psVar5 = (storage_t<tinyusdz::value::matrix3d> *)((long)psVar5 + (ulong)bVar6 * -0x10 + 8);
      }
      if (bVar1 == false) {
        value->has_value_ = true;
      }
    }
  }
  return bVar2;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::matrix3d> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::matrix3d v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}